

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

HMODULE LoadLibraryExW(LPCWSTR lpLibFileName,HANDLE hFile,DWORD dwFlags)

{
  undefined8 lpPath;
  bool bVar1;
  size_t sVar2;
  HMODULE pVVar3;
  long in_FS_OFFSET;
  int local_6c;
  undefined1 local_68 [4];
  INT name_length;
  PathCharString pathstr;
  
  pathstr.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  if (dwFlags != 0) {
    pVVar3 = (HMODULE)0x0;
    fprintf(_stderr,"] %s %s:%d","LoadLibraryExW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
            ,0xdd);
    fprintf(_stderr,"Needs Implementation!!!");
    goto LAB_001ce526;
  }
  pathstr._32_8_ = local_68;
  pathstr.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_001ce543;
  bVar1 = LOADVerifyLibraryPath<char16_t>(lpLibFileName);
  if (bVar1) {
    sVar2 = PAL_wcslen(lpLibFileName);
    StackString<32UL,_char>::Resize
              ((StackString<32UL,_char> *)local_68,(long)MaxWCharToAcpLength * (sVar2 + 1));
    lpPath = pathstr._32_8_;
    if (pathstr._32_8_ == 0) goto LAB_001ce515;
    bVar1 = LOADConvertLibraryPathWideStringToMultibyteString
                      (lpLibFileName,(LPSTR)pathstr._32_8_,&local_6c);
    if (!bVar1) goto LAB_001ce515;
    FILEDosToUnixPathA((LPSTR)lpPath);
    if ((ulong)(long)local_6c < pathstr.m_size) {
      pathstr.m_size = (long)local_6c;
    }
    *(undefined1 *)(pathstr._32_8_ + pathstr.m_size) = 0;
    pVVar3 = LOADLoadLibrary((LPCSTR)lpPath,1);
  }
  else {
LAB_001ce515:
    pVVar3 = (HMODULE)0x0;
  }
  if (PAL_InitializeChakraCoreCalled == false) {
LAB_001ce543:
    abort();
  }
  StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_68);
LAB_001ce526:
  if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == pathstr.m_count) {
    return pVVar3;
  }
  __stack_chk_fail();
}

Assistant:

HMODULE
PALAPI
LoadLibraryExW(
    IN LPCWSTR lpLibFileName,
    IN /*Reserved*/ HANDLE hFile,
    IN DWORD dwFlags)
{
    if (dwFlags != 0)
    {
        // UNIXTODO: Implement this!
        ASSERT("Needs Implementation!!!");
        return nullptr;
    }

    CHAR * lpstr;
    INT name_length;
    PathCharString pathstr;
    HMODULE hModule = nullptr;

    PERF_ENTRY(LoadLibraryExW);
    ENTRY("LoadLibraryExW (lpLibFileName=%p (%S)) \n",
          lpLibFileName ? lpLibFileName : W16_NULLSTRING,
          lpLibFileName ? lpLibFileName : W16_NULLSTRING);

    if (!LOADVerifyLibraryPath(lpLibFileName))
    {
        goto done;
    }

    lpstr = pathstr.OpenStringBuffer((PAL_wcslen(lpLibFileName)+1) * MaxWCharToAcpLength);
    if (nullptr == lpstr)
    {
        goto done;
    }
    if (!LOADConvertLibraryPathWideStringToMultibyteString(lpLibFileName, lpstr, &name_length))
    {
        goto done;
    }

    /* do the Dos/Unix conversion on our own copy of the name */
    FILEDosToUnixPathA(lpstr);
    pathstr.CloseBuffer(name_length);

    /* let LOADLoadLibrary call SetLastError in case of failure */
    hModule = LOADLoadLibrary(lpstr, TRUE);

done:
    LOGEXIT("LoadLibraryExW returns HMODULE %p\n", hModule);
    PERF_EXIT(LoadLibraryExW);
    return hModule;
}